

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int Index(int ndim,int *subscript,int *dims)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  if (0 < ndim) {
    uVar2 = 0;
    iVar3 = 1;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + subscript[uVar2] * iVar3;
      iVar3 = iVar3 * dims[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)ndim != uVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Index(int ndim, int subscript[], int dims[])
{
    int idx = 0, i, factor=1;
    for(i=0;i<ndim;i++){
        idx += subscript[i]*factor;
        factor *= dims[i];
    }
    return idx;
}